

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::ProfileDelete(void)

{
  Sdk *this;
  string *distinct_id;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  PropertiesNode properties_node;
  
  if (instance_ != (Sdk *)0x0) {
    PropertiesNode::PropertiesNode((PropertiesNode *)local_40);
    this = instance_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"profile_delete",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    distinct_id = &instance_->distinct_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",&local_c1);
    AddEvent(this,(string *)local_60,(string *)local_98,(ObjectNode *)local_40,distinct_id,
             (string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    PropertiesNode::~PropertiesNode((PropertiesNode *)local_40);
  }
  return;
}

Assistant:

void Sdk::ProfileDelete() {
  if (instance_) {
    PropertiesNode properties_node;
    instance_->AddEvent("profile_delete",
                        "",
                        properties_node,
                        instance_->distinct_id_,
                        "");
  }
}